

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console_reporter.cc
# Opt level: O0

bool __thiscall benchmark::ConsoleReporter::ReportContext(ConsoleReporter *this,Context *context)

{
  ostream *poVar1;
  long lVar2;
  long in_RSI;
  BenchmarkReporter *in_RDI;
  string str;
  allocator local_61;
  string local_60 [40];
  Context *in_stack_ffffffffffffffc8;
  ostream *in_stack_ffffffffffffffd0;
  
  in_RDI[1]._vptr_BenchmarkReporter = *(_func_int ***)(in_RSI + 0x18);
  BenchmarkReporter::GetErrorStream(in_RDI);
  BenchmarkReporter::PrintBasicContext(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  FormatString_abi_cxx11_
            (&stack0xffffffffffffffd0,"%-*s %13s %13s %10s\n",
             (ulong)*(uint *)&in_RDI[1]._vptr_BenchmarkReporter,"Benchmark","Time","CPU",
             "Iterations");
  poVar1 = BenchmarkReporter::GetOutputStream(in_RDI);
  poVar1 = std::operator<<(poVar1,(string *)&stack0xffffffffffffffd0);
  lVar2 = std::__cxx11::string::length();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,lVar2 - 1,'-',&local_61);
  poVar1 = std::operator<<(poVar1,local_60);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return true;
}

Assistant:

bool ConsoleReporter::ReportContext(const Context& context) {
  name_field_width_ = context.name_field_width;

  PrintBasicContext(&GetErrorStream(), context);

#ifdef BENCHMARK_OS_WINDOWS
  if (color_output_ && &std::cout != &GetOutputStream()) {
      GetErrorStream() << "Color printing is only supported for stdout on windows."
                          " Disabling color printing\n";
      color_output_ = false;
  }
#endif
  std::string str = FormatString("%-*s %13s %13s %10s\n",
                             static_cast<int>(name_field_width_), "Benchmark",
                             "Time", "CPU", "Iterations");
  GetOutputStream() << str << std::string(str.length() - 1, '-') << "\n";

  return true;
}